

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeString(ParserImpl *this,string *text)

{
  bool bVar1;
  Token *pTVar2;
  AlphaNum *in_RCX;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  string_view local_30;
  string *local_20;
  string *text_local;
  ParserImpl *this_local;
  
  local_20 = text;
  text_local = (string *)this;
  bVar1 = LookingAtType(this,TYPE_STRING);
  if (bVar1) {
    std::__cxx11::string::clear();
    while( true ) {
      bVar1 = LookingAtType(this,TYPE_STRING);
      if (!bVar1) break;
      pTVar2 = protobuf::io::Tokenizer::current(&this->tokenizer_);
      protobuf::io::Tokenizer::ParseStringAppend(&pTVar2->text,local_20);
      protobuf::io::Tokenizer::Next(&this->tokenizer_);
    }
    this_local._7_1_ = true;
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_80,"Expected string, got: ");
    pTVar2 = protobuf::io::Tokenizer::current(&this->tokenizer_);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_b0,&pTVar2->text);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_50,(lts_20250127 *)&local_80,&local_b0,in_RCX);
    local_30 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    ReportError(this,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsumeString(std::string* text) {
    if (!LookingAtType(io::Tokenizer::TYPE_STRING)) {
      ReportError(
          absl::StrCat("Expected string, got: ", tokenizer_.current().text));
      return false;
    }

    text->clear();
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(tokenizer_.current().text, text);

      tokenizer_.Next();
    }

    return true;
  }